

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_alloter.cpp
# Opt level: O1

void * __thiscall cppnet::PoolAlloter::ReFill(PoolAlloter *this,uint32_t size,uint32_t num)

{
  ulong uVar1;
  void *pvVar2;
  int iVar3;
  MemNode *pMVar4;
  MemNode *pMVar5;
  uint32_t nums;
  uint32_t local_1c;
  
  uVar1 = (ulong)size;
  local_1c = num;
  pvVar2 = ChunkAlloc(this,size,&local_1c);
  if (local_1c != 1) {
    pMVar4 = (MemNode *)((long)pvVar2 + uVar1);
    (this->_free_list).
    super__Vector_base<cppnet::PoolAlloter::MemNode_*,_std::allocator<cppnet::PoolAlloter::MemNode_*>_>
    ._M_impl.super__Vector_impl_data._M_start[(size + 7 >> 3) - 1] = pMVar4;
    if (local_1c != 2) {
      iVar3 = local_1c - 2;
      pMVar5 = (MemNode *)((long)pvVar2 + uVar1 * 2);
      do {
        pMVar4->_next = pMVar5;
        pMVar4 = (MemNode *)((long)pMVar4 + uVar1);
        pMVar5 = (MemNode *)((long)pMVar5 + uVar1);
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    }
    pMVar4->_next = (MemNode *)0x0;
  }
  return pvVar2;
}

Assistant:

void* PoolAlloter::ReFill(uint32_t size, uint32_t num) {
    uint32_t nums = num;

    char* chunk = (char*)ChunkAlloc(size, nums);

    MemNode* volatile* my_free;
    MemNode* res, *current, *next;
    if (1 == nums) {
        return chunk;
    }

    res = (MemNode*)chunk;
    
    my_free = &(_free_list[FreeListIndex(size)]);

    *my_free = next = (MemNode*)(chunk + size);
    for (uint32_t i = 1;; i++) {
        current = next;
        next = (MemNode*)((char*)next + size);
        if (nums - 1 == i) {
            current->_next = nullptr;
            break;

        } else {
            current->_next = next;
        }
    }
    return res;
}